

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath * testing::internal::FilePath::GetCurrentDir(void)

{
  FilePath *in_RDI;
  char *result;
  char cwd [4097];
  string *pathname;
  FilePath *pFVar1;
  FilePath *this;
  undefined1 local_1041 [33];
  char *local_1020;
  FilePath local_1018 [128];
  
  memset(local_1018,0,0x1001);
  local_1020 = getcwd((char *)local_1018,0x1001);
  if (local_1020 == (char *)0x0) {
    pFVar1 = (FilePath *)0x176866;
  }
  else {
    pFVar1 = local_1018;
  }
  pathname = (string *)local_1041;
  this = pFVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_1041 + 1),(char *)pFVar1,(allocator *)pathname);
  FilePath(this,pathname);
  std::__cxx11::string::~string((string *)(local_1041 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1041);
  return in_RDI;
}

Assistant:

FilePath FilePath::GetCurrentDir() {
#if GTEST_OS_WINDOWS_MOBILE || GTEST_OS_WINDOWS_PHONE || \
    GTEST_OS_WINDOWS_RT || GTEST_OS_ESP8266 || GTEST_OS_ESP32
  // These platforms do not have a current directory, so we just return
  // something reasonable.
  return FilePath(kCurrentDirectoryString);
#elif GTEST_OS_WINDOWS
  char cwd[GTEST_PATH_MAX_ + 1] = { '\0' };
  return FilePath(_getcwd(cwd, sizeof(cwd)) == nullptr ? "" : cwd);
#else
  char cwd[GTEST_PATH_MAX_ + 1] = { '\0' };
  char* result = getcwd(cwd, sizeof(cwd));
# if GTEST_OS_NACL
  // getcwd will likely fail in NaCl due to the sandbox, so return something
  // reasonable. The user may have provided a shim implementation for getcwd,
  // however, so fallback only when failure is detected.
  return FilePath(result == nullptr ? kCurrentDirectoryString : cwd);
# endif  // GTEST_OS_NACL
  return FilePath(result == nullptr ? "" : cwd);
#endif  // GTEST_OS_WINDOWS_MOBILE
}